

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

TanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_tanh(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2f8) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2f8;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    TanhLayerParams::TanhLayerParams(this_00.tanh_);
    (this->layer_).tanh_ = (TanhLayerParams *)this_00;
  }
  return (TanhLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::TanhLayerParams* NeuralNetworkLayer::mutable_tanh() {
  if (!has_tanh()) {
    clear_layer();
    set_has_tanh();
    layer_.tanh_ = new ::CoreML::Specification::TanhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.tanh)
  return layer_.tanh_;
}